

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.h
# Opt level: O3

void __thiscall server::ctfservmode::newmap(ctfservmode *this)

{
  if (0 < (this->holdspawns).ulen) {
    (this->holdspawns).ulen = 0;
  }
  if (0 < (this->flags).ulen) {
    (this->flags).ulen = 0;
  }
  this->scores[0] = 0;
  this->scores[1] = 0;
  this->notgotflags = false;
  return;
}

Assistant:

void shrink(int i) { ASSERT(i<=ulen); if(isclass<T>::no) ulen = i; else while(ulen>i) drop(); }